

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_utils.h
# Opt level: O2

int VP8RandomBits(VP8Random *rg,int num_bits)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = rg->tab_[rg->index1_] - rg->tab_[rg->index2_];
  iVar3 = rg->amp_;
  rg->tab_[rg->index1_] = uVar4 & 0x7fffffff;
  uVar1 = rg->index1_;
  uVar2 = rg->index2_;
  uVar5 = ~CONCAT44(-(uint)(uVar2 + 1 == 0x37),-(uint)(uVar1 + 1 == 0x37)) &
          CONCAT44(uVar2 + 1,uVar1 + 1);
  rg->index1_ = (int)uVar5;
  rg->index2_ = (int)(uVar5 >> 0x20);
  return (1 << ((char)num_bits - 1U & 0x1f)) +
         (((int)(uVar4 * 2) >> (-(char)num_bits & 0x1fU)) * iVar3 >> 8);
}

Assistant:

static WEBP_INLINE int VP8RandomBits2(VP8Random* const rg, int num_bits,
                                      int amp) {
  int diff;
  assert(num_bits + VP8_RANDOM_DITHER_FIX <= 31);
  diff = rg->tab_[rg->index1_] - rg->tab_[rg->index2_];
  if (diff < 0) diff += (1u << 31);
  rg->tab_[rg->index1_] = diff;
  if (++rg->index1_ == VP8_RANDOM_TABLE_SIZE) rg->index1_ = 0;
  if (++rg->index2_ == VP8_RANDOM_TABLE_SIZE) rg->index2_ = 0;
  // sign-extend, 0-center
  diff = (int)((uint32_t)diff << 1) >> (32 - num_bits);
  diff = (diff * amp) >> VP8_RANDOM_DITHER_FIX;  // restrict range
  diff += 1 << (num_bits - 1);                   // shift back to 0.5-center
  return diff;
}